

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::file_observer>
::store_if_better(solver_functor<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::file_observer>
                  *this,bit_array *x,int remaining,long i)

{
  long lVar1;
  
  if (remaining < (this->m_best).remaining_constraints) {
    bit_array_impl::operator=((bit_array_impl *)&this->m_best,&x->super_bit_array_impl);
    lVar1 = std::chrono::_V2::steady_clock::now();
    (this->m_end).__d.__r = lVar1;
    (this->m_best).duration = (double)(lVar1 - (this->m_begin).__d.__r) / 1000000000.0;
    (this->m_best).loop = i;
    (this->m_best).remaining_constraints = remaining;
  }
  return;
}

Assistant:

void store_if_better(const bit_array& x, int remaining, long int i)
    {
        if (m_best.remaining_constraints > remaining) {
            m_best.x = x;
            m_best.duration = duration();
            m_best.loop = i;
            m_best.remaining_constraints = remaining;
        }
    }